

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAnd(sqlite3 *db,Expr *pLeft,Expr *pRight)

{
  int iVar1;
  Expr *pNew;
  Expr *pRight_local;
  Expr *pLeft_local;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)pRight;
  if ((pLeft != (Expr *)0x0) && (db_local = (sqlite3 *)pLeft, pRight != (Expr *)0x0)) {
    iVar1 = exprAlwaysFalse(pLeft);
    if ((iVar1 == 0) && (iVar1 = exprAlwaysFalse(pRight), iVar1 == 0)) {
      db_local = (sqlite3 *)sqlite3ExprAlloc(db,0x2c,(Token *)0x0,0);
      sqlite3ExprAttachSubtrees(db,(Expr *)db_local,pLeft,pRight);
    }
    else {
      sqlite3ExprDelete(db,pLeft);
      sqlite3ExprDelete(db,pRight);
      db_local = (sqlite3 *)sqlite3ExprAlloc(db,0x8f,sqlite3IntTokens,0);
    }
  }
  return (Expr *)db_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(sqlite3 *db, Expr *pLeft, Expr *pRight){
  if( pLeft==0 ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else if( exprAlwaysFalse(pLeft) || exprAlwaysFalse(pRight) ){
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
    return sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0);
  }else{
    Expr *pNew = sqlite3ExprAlloc(db, TK_AND, 0, 0);
    sqlite3ExprAttachSubtrees(db, pNew, pLeft, pRight);
    return pNew;
  }
}